

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader,int no)

{
  xmlNs *local_40;
  xmlNsPtr ns;
  xmlAttrPtr cur;
  int i;
  xmlChar *ret;
  int no_local;
  xmlTextReaderPtr reader_local;
  
  if (reader == (xmlTextReaderPtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->node == (xmlNodePtr)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else if (reader->curnode == (xmlNodePtr)0x0) {
    if (reader->node->type == XML_ELEMENT_NODE) {
      local_40 = reader->node->nsDef;
      for (cur._4_4_ = 0; cur._4_4_ < no && local_40 != (xmlNs *)0x0; cur._4_4_ = cur._4_4_ + 1) {
        local_40 = local_40->next;
      }
      if (local_40 == (xmlNs *)0x0) {
        ns = (xmlNsPtr)reader->node->properties;
        if ((_xmlAttr *)ns == (_xmlAttr *)0x0) {
          reader_local = (xmlTextReaderPtr)0x0;
        }
        else {
          for (; cur._4_4_ < no; cur._4_4_ = cur._4_4_ + 1) {
            ns = ns[1].next;
            if (ns == (_xmlNs *)0x0) {
              return (xmlChar *)0x0;
            }
          }
          if (ns->prefix == (xmlChar *)0x0) {
            reader_local = (xmlTextReaderPtr)0x0;
          }
          else {
            reader_local = (xmlTextReaderPtr)
                           xmlNodeListGetString(reader->node->doc,(xmlNode *)ns->prefix,1);
            if (reader_local == (xmlTextReaderPtr)0x0) {
              xmlTextReaderErrMemory(reader);
            }
          }
        }
      }
      else {
        reader_local = (xmlTextReaderPtr)readerStrdup(reader,local_40->href);
      }
    }
    else {
      reader_local = (xmlTextReaderPtr)0x0;
    }
  }
  else {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  return (xmlChar *)reader_local;
}

Assistant:

xmlChar *
xmlTextReaderGetAttributeNo(xmlTextReaderPtr reader, int no) {
    xmlChar *ret;
    int i;
    xmlAttrPtr cur;
    xmlNsPtr ns;

    if (reader == NULL)
	return(NULL);
    if (reader->node == NULL)
	return(NULL);
    if (reader->curnode != NULL)
	return(NULL);
    /* TODO: handle the xmlDecl */
    if (reader->node->type != XML_ELEMENT_NODE)
	return(NULL);

    ns = reader->node->nsDef;
    for (i = 0;(i < no) && (ns != NULL);i++) {
	ns = ns->next;
    }
    if (ns != NULL)
	return(readerStrdup(reader, ns->href));

    cur = reader->node->properties;
    if (cur == NULL)
	return(NULL);
    for (;i < no;i++) {
	cur = cur->next;
	if (cur == NULL)
	    return(NULL);
    }
    /* TODO walk the DTD if present */

    if (cur->children == NULL)
        return(NULL);
    ret = xmlNodeListGetString(reader->node->doc, cur->children, 1);
    if (ret == NULL)
        xmlTextReaderErrMemory(reader);
    return(ret);
}